

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_write_tlm(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,
                          opj_event_mgr_t *p_manager)

{
  int iVar1;
  uint uVar2;
  OPJ_BYTE *pOVar3;
  OPJ_OFF_T OVar4;
  OPJ_SIZE_T OVar5;
  OPJ_BYTE *new_header_tile_data;
  OPJ_UINT32 l_tlm_size;
  OPJ_BYTE *l_current_data;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x103a,
                  "OPJ_BOOL opj_j2k_write_tlm(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager != (opj_event_mgr_t *)0x0) {
    if (p_stream == (opj_stream_private_t *)0x0) {
      __assert_fail("p_stream != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                    ,0x103c,
                    "OPJ_BOOL opj_j2k_write_tlm(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                   );
    }
    iVar1 = (p_j2k->m_specific_param).m_decoder.m_start_tile_x * 5;
    uVar2 = iVar1 + 6;
    if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar2) {
      pOVar3 = (OPJ_BYTE *)
               opj_realloc((p_j2k->m_specific_param).m_encoder.m_header_tile_data,(ulong)uVar2);
      if (pOVar3 == (OPJ_BYTE *)0x0) {
        opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
        (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
        (p_j2k->m_specific_param).m_decoder.m_last_tile_part = 0;
        opj_event_msg(p_manager,1,"Not enough memory to write TLM marker\n");
        return 0;
      }
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data = pOVar3;
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar2;
    }
    pOVar3 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
    OVar4 = opj_stream_tell(p_stream);
    (p_j2k->m_specific_param).m_encoder.m_tlm_start = OVar4;
    opj_write_bytes_LE(pOVar3,0xff55,2);
    opj_write_bytes_LE(pOVar3 + 2,iVar1 + 4,2);
    opj_write_bytes_LE(pOVar3 + 4,0,1);
    opj_write_bytes_LE(pOVar3 + 5,0x50,1);
    OVar5 = opj_stream_write_data
                      (p_stream,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,(ulong)uVar2,
                       p_manager);
    p_j2k_local._4_4_ = (uint)(OVar5 == uVar2);
    return p_j2k_local._4_4_;
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0x103b,
                "OPJ_BOOL opj_j2k_write_tlm(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_write_tlm(opj_j2k_t *p_j2k,
                                  opj_stream_private_t *p_stream,
                                  opj_event_mgr_t * p_manager
                                 )
{
    OPJ_BYTE * l_current_data = 00;
    OPJ_UINT32 l_tlm_size;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    l_tlm_size = 6 + (5 * p_j2k->m_specific_param.m_encoder.m_total_tile_parts);

    if (l_tlm_size > p_j2k->m_specific_param.m_encoder.m_header_tile_data_size) {
        OPJ_BYTE *new_header_tile_data = (OPJ_BYTE *) opj_realloc(
                                             p_j2k->m_specific_param.m_encoder.m_header_tile_data, l_tlm_size);
        if (! new_header_tile_data) {
            opj_free(p_j2k->m_specific_param.m_encoder.m_header_tile_data);
            p_j2k->m_specific_param.m_encoder.m_header_tile_data = NULL;
            p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = 0;
            opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to write TLM marker\n");
            return OPJ_FALSE;
        }
        p_j2k->m_specific_param.m_encoder.m_header_tile_data = new_header_tile_data;
        p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = l_tlm_size;
    }

    l_current_data = p_j2k->m_specific_param.m_encoder.m_header_tile_data;

    /* change the way data is written to avoid seeking if possible */
    /* TODO */
    p_j2k->m_specific_param.m_encoder.m_tlm_start = opj_stream_tell(p_stream);

    opj_write_bytes(l_current_data, J2K_MS_TLM,
                    2);                                   /* TLM */
    l_current_data += 2;

    opj_write_bytes(l_current_data, l_tlm_size - 2,
                    2);                                 /* Lpoc */
    l_current_data += 2;

    opj_write_bytes(l_current_data, 0,
                    1);                                                    /* Ztlm=0*/
    ++l_current_data;

    opj_write_bytes(l_current_data, 0x50,
                    1);                                                 /* Stlm ST=1(8bits-255 tiles max),SP=1(Ptlm=32bits) */
    ++l_current_data;

    /* do nothing on the 5 * l_j2k->m_specific_param.m_encoder.m_total_tile_parts remaining data */
    if (opj_stream_write_data(p_stream,
                              p_j2k->m_specific_param.m_encoder.m_header_tile_data, l_tlm_size,
                              p_manager) != l_tlm_size) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}